

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void HelpMarker(char *desc)

{
  bool bVar1;
  float fVar2;
  char *desc_local;
  
  ImGui::TextDisabled("(?)");
  bVar1 = ImGui::IsItemHovered(0);
  if (bVar1) {
    ImGui::BeginTooltip();
    fVar2 = ImGui::GetFontSize();
    ImGui::PushTextWrapPos(fVar2 * 35.0);
    ImGui::TextUnformatted(desc,(char *)0x0);
    ImGui::PopTextWrapPos();
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

static void HelpMarker(const char* desc)
{
    ImGui::TextDisabled("(?)");
    if (ImGui::IsItemHovered())
    {
        ImGui::BeginTooltip();
        ImGui::PushTextWrapPos(ImGui::GetFontSize() * 35.0f);
        ImGui::TextUnformatted(desc);
        ImGui::PopTextWrapPos();
        ImGui::EndTooltip();
    }
}